

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_args.cpp
# Opt level: O0

Result<void> *
ApplyArgsManOptions(ArgsManager *argsman,CChainParams *chainparams,MemPoolOptions *mempool_opts)

{
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  undefined1 uVar2;
  int64_t iVar3;
  long *plVar4;
  undefined4 *in_RCX;
  MemPoolLimits *in_RSI;
  Result<void> *in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar5;
  optional<long> parsed;
  optional<long> min_relay_feerate;
  optional<long> inc_relay_fee;
  optional<long> hours;
  optional<long> mb;
  undefined4 in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff68c;
  char *in_stack_fffffffffffff690;
  Result<void> *in_stack_fffffffffffff698;
  Result<void> *pRVar6;
  CFeeRate *in_stack_fffffffffffff6a0;
  undefined7 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6af;
  ArgsManager *in_stack_fffffffffffff6b0;
  string *in_stack_fffffffffffff6b8;
  undefined7 in_stack_fffffffffffff6c0;
  undefined1 in_stack_fffffffffffff6c7;
  ArgsManager *in_stack_fffffffffffff6c8;
  ArgsManager *in_stack_fffffffffffff6d0;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined7 in_stack_fffffffffffff6e8;
  LogFlags in_stack_fffffffffffff6f0;
  MemPoolLimits *flag;
  undefined8 in_stack_fffffffffffff6f8;
  int iVar7;
  MemPoolLimits *in_stack_fffffffffffff708;
  ArgsManager *in_stack_fffffffffffff710;
  ConstevalFormatString<1U> in_stack_fffffffffffff738;
  ConstevalFormatString<0U> fmt;
  string *in_stack_fffffffffffff740;
  allocator<char> *paVar8;
  char *in_stack_fffffffffffff748;
  size_t in_stack_fffffffffffff750;
  char *in_stack_fffffffffffff758;
  Level in_stack_fffffffffffff830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff840;
  allocator<char> local_6c1 [37];
  allocator<char> local_69c;
  undefined1 local_69b [2];
  undefined1 local_699 [13];
  allocator<char> local_68c;
  allocator<char> local_68b;
  allocator<char> local_68a;
  allocator<char> local_689 [10];
  allocator<char> local_67f;
  allocator<char> local_67e;
  allocator<char> local_67d [42];
  allocator<char> local_653;
  allocator<char> local_652;
  allocator<char> local_651 [11];
  allocator<char> local_646;
  allocator<char> local_645;
  allocator<char> local_644;
  allocator<char> local_643;
  allocator<char> local_642;
  allocator<char> local_641 [14];
  allocator<char> local_633;
  allocator<char> local_632;
  allocator<char> local_631 [22];
  allocator<char> local_61b;
  allocator<char> local_61a;
  allocator<char> local_619;
  _Storage<long,_true> local_618;
  undefined1 local_610;
  _Storage<long,_true> local_608;
  undefined1 local_600;
  _Storage<long,_true> local_5f8;
  undefined1 local_5f0;
  _Storage<long,_true> local_5e8;
  undefined1 local_5e0;
  _Storage<long,_true> local_5d8;
  undefined1 local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508 [16];
  Result<void> local_308 [10];
  long local_8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
             (allocator<char> *)in_stack_fffffffffffff6c8);
  iVar3 = ArgsManager::GetIntArg
                    ((ArgsManager *)in_stack_fffffffffffff690,
                     (string *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                     (int64_t)in_stack_fffffffffffff698);
  *in_RCX = (int)iVar3;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::allocator<char>::~allocator(&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
             (allocator<char> *)in_stack_fffffffffffff6c8);
  oVar5 = ArgsManager::GetIntArg(in_stack_fffffffffffff6d0,(string *)in_stack_fffffffffffff6c8);
  local_5d8._M_value =
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_5d0 = oVar5.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::allocator<char>::~allocator(&local_61a);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<long> *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688)
                    );
  if (bVar1) {
    plVar4 = std::optional<long>::operator*
                       ((optional<long> *)
                        CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    *(long *)(in_RCX + 2) = *plVar4 * 1000000;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
             (allocator<char> *)in_stack_fffffffffffff6c8);
  oVar5 = ArgsManager::GetIntArg(in_stack_fffffffffffff6d0,(string *)in_stack_fffffffffffff6c8);
  local_5e8._M_value =
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_5e0 = oVar5.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::allocator<char>::~allocator(&local_61b);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<long> *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688)
                    );
  if (bVar1) {
    std::optional<long>::operator*
              ((optional<long> *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::chrono::duration<long,std::ratio<3600l,1l>>::duration<long,void>
              ((duration<long,_std::ratio<3600L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),(long *)0x11dab0c);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff690,
               (duration<long,_std::ratio<3600L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    *(undefined8 *)(in_RCX + 4) = local_631._9_8_;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
             (allocator<char> *)in_stack_fffffffffffff6c8);
  bVar1 = ArgsManager::IsArgSet
                    (in_stack_fffffffffffff6b0,
                     (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::allocator<char>::~allocator(local_631);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
               (allocator<char> *)in_stack_fffffffffffff6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
               (allocator<char> *)in_stack_fffffffffffff6c8);
    ArgsManager::GetArg(in_stack_fffffffffffff6c8,
                        (string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
                        in_stack_fffffffffffff6b8);
    oVar5 = ParseMoney(in_stack_fffffffffffff740);
    local_5f8._M_value =
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_5f0 = oVar5.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::allocator<char>::~allocator(&local_633);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::allocator<char>::~allocator(&local_632);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<long> *)
                       CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
                 (allocator<char> *)in_stack_fffffffffffff6c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
                 (allocator<char> *)in_stack_fffffffffffff6c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
                 (allocator<char> *)in_stack_fffffffffffff6c8);
      ArgsManager::GetArg(in_stack_fffffffffffff6c8,
                          (string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
                          in_stack_fffffffffffff6b8);
      common::AmountErrMsg
                ((string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
                 in_stack_fffffffffffff6b8);
      util::Result<void>::Result(in_stack_fffffffffffff698,(Error *)in_stack_fffffffffffff690);
      util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator(&local_643);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator(&local_642);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator(local_641);
      goto LAB_011dc52e;
    }
    std::optional<long>::value((optional<long> *)in_stack_fffffffffffff698);
    CFeeRate::CFeeRate<long>
              ((CFeeRate *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),0x11dad60);
    *(undefined8 *)(in_RCX + 6) = local_641._1_8_;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
             (allocator<char> *)in_stack_fffffffffffff6c8);
  bVar1 = ArgsManager::IsArgSet
                    (in_stack_fffffffffffff6b0,
                     (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::allocator<char>::~allocator(&local_644);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
               (allocator<char> *)in_stack_fffffffffffff6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
               (allocator<char> *)in_stack_fffffffffffff6c8);
    ArgsManager::GetArg(in_stack_fffffffffffff6c8,
                        (string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
                        in_stack_fffffffffffff6b8);
    oVar5 = ParseMoney(in_stack_fffffffffffff740);
    local_608._M_value =
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_600 = oVar5.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::allocator<char>::~allocator(&local_646);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::allocator<char>::~allocator(&local_645);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<long> *)
                       CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
                 (allocator<char> *)in_stack_fffffffffffff6c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
                 (allocator<char> *)in_stack_fffffffffffff6c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
                 (allocator<char> *)in_stack_fffffffffffff6c8);
      ArgsManager::GetArg(in_stack_fffffffffffff6c8,
                          (string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
                          in_stack_fffffffffffff6b8);
      common::AmountErrMsg
                ((string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
                 in_stack_fffffffffffff6b8);
      util::Result<void>::Result(in_stack_fffffffffffff698,(Error *)in_stack_fffffffffffff690);
      util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator(&local_653);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator(&local_652);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator(local_651);
      goto LAB_011dc52e;
    }
    std::optional<long>::value((optional<long> *)in_stack_fffffffffffff698);
    CFeeRate::CFeeRate<long>
              ((CFeeRate *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),0x11db2e3);
    *(undefined8 *)(in_RCX + 8) = local_651._1_8_;
  }
  else {
    bVar1 = operator>((CFeeRate *)in_stack_fffffffffffff698,(CFeeRate *)in_stack_fffffffffffff690);
    if (bVar1) {
      *(undefined8 *)(in_RCX + 8) = *(undefined8 *)(in_RCX + 6);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                 (char *)in_stack_fffffffffffff6a0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                 (char *)in_stack_fffffffffffff6a0);
      local_67d[1] = (allocator<char>)0x3;
      local_67d[2] = (allocator<char>)0x0;
      local_67d[3] = (allocator<char>)0x0;
      local_67d[4] = (allocator<char>)0x0;
      pRVar6 = local_308;
      CFeeRate::ToString_abi_cxx11_
                (in_stack_fffffffffffff6a0,(FeeEstimateMode *)in_stack_fffffffffffff698);
      in_stack_fffffffffffff690 = "Increasing minrelaytxfee to %s to match incrementalrelayfee\n";
      in_stack_fffffffffffff688 = 2;
      logging_function._M_str = in_stack_fffffffffffff758;
      logging_function._M_len = in_stack_fffffffffffff750;
      source_file._M_str = in_stack_fffffffffffff748;
      source_file._M_len = (size_t)in_stack_fffffffffffff740;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,iVar7,in_stack_fffffffffffff6f0,
                 in_stack_fffffffffffff830,in_stack_fffffffffffff738,in_stack_fffffffffffff840);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      in_stack_fffffffffffff698 = pRVar6;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
             (allocator<char> *)in_stack_fffffffffffff6c8);
  bVar1 = ArgsManager::IsArgSet
                    (in_stack_fffffffffffff6b0,
                     (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::allocator<char>::~allocator(local_67d);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
               (allocator<char> *)in_stack_fffffffffffff6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
               (allocator<char> *)in_stack_fffffffffffff6c8);
    ArgsManager::GetArg(in_stack_fffffffffffff6c8,
                        (string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
                        in_stack_fffffffffffff6b8);
    oVar5 = ParseMoney(in_stack_fffffffffffff740);
    local_618._M_value =
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_610 = oVar5.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::allocator<char>::~allocator(&local_67f);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::allocator<char>::~allocator(&local_67e);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<long> *)
                       CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
                 (allocator<char> *)in_stack_fffffffffffff6c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
                 (allocator<char> *)in_stack_fffffffffffff6c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
                 (allocator<char> *)in_stack_fffffffffffff6c8);
      ArgsManager::GetArg(in_stack_fffffffffffff6c8,
                          (string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
                          in_stack_fffffffffffff6b8);
      common::AmountErrMsg
                ((string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
                 in_stack_fffffffffffff6b8);
      util::Result<void>::Result(in_stack_fffffffffffff698,(Error *)in_stack_fffffffffffff690);
      util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator(&local_68b);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator(&local_68a);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator(local_689);
      goto LAB_011dc52e;
    }
    std::optional<long>::value((optional<long> *)in_stack_fffffffffffff698);
    CFeeRate::CFeeRate<long>
              ((CFeeRate *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),0x11db99a);
    *(undefined8 *)(in_RCX + 10) = local_689._1_8_;
  }
  paVar8 = &local_68c;
  fmt.fmt = (char *)in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
             (allocator<char> *)in_stack_fffffffffffff6c8);
  bVar1 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffff690,
                     (string *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                     SUB81((ulong)in_stack_fffffffffffff698 >> 0x38,0));
  *(bool *)(in_RCX + 0xe) = bVar1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::allocator<char>::~allocator(&local_68c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
             (allocator<char> *)in_stack_fffffffffffff6c8);
  bVar1 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffff690,
                     (string *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                     SUB81((ulong)in_stack_fffffffffffff698 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::allocator<char>::~allocator((allocator<char> *)(local_699 + 0xc));
  if (bVar1) {
    in_stack_fffffffffffff710 = (ArgsManager *)local_699;
    in_stack_fffffffffffff708 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
               (allocator<char> *)in_stack_fffffffffffff6c8);
    local_699._1_8_ =
         ArgsManager::GetIntArg
                   ((ArgsManager *)in_stack_fffffffffffff690,
                    (string *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                    (int64_t)in_stack_fffffffffffff698);
    std::optional<unsigned_int>::operator=
              ((optional<unsigned_int> *)in_stack_fffffffffffff698,(long *)in_stack_fffffffffffff690
              );
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::allocator<char>::~allocator((allocator<char> *)local_699);
  }
  else {
    std::optional<unsigned_int>::operator=((optional<unsigned_int> *)(in_RCX + 0xc));
  }
  iVar7 = (int)((ulong)(local_69b + 1) >> 0x20);
  flag = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
             (allocator<char> *)in_stack_fffffffffffff6c8);
  uVar2 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffff690,
                     (string *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                     SUB81((ulong)in_stack_fffffffffffff698 >> 0x38,0));
  *(byte *)((long)in_RCX + 0x39) = (uVar2 ^ 0xff) & 1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::allocator<char>::~allocator((allocator<char> *)(local_69b + 1));
  bVar1 = CChainParams::IsTestChain
                    ((CChainParams *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  if ((bVar1) || ((*(byte *)((long)in_RCX + 0x39) & 1) != 0)) {
    __s = &local_69c;
    std::allocator<char>::allocator();
    uVar2 = (undefined1)((ulong)in_stack_fffffffffffff698 >> 0x38);
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d8,(char *)__s,(allocator<char> *)in_RSI);
    bVar1 = ArgsManager::GetBoolArg
                      ((ArgsManager *)in_stack_fffffffffffff690,
                       (string *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                       (bool)uVar2);
    *(bool *)((long)in_RCX + 0x3a) = bVar1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::allocator<char>::~allocator(&local_69c);
    if ((*(byte *)((long)in_RCX + 0x3a) & 1) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                 (char *)in_stack_fffffffffffff6a0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                 (char *)in_stack_fffffffffffff6a0);
      in_stack_fffffffffffff688 = 2;
      in_stack_fffffffffffff690 =
           "Warning: mempoolfullrbf=0 set but deprecated and will be removed in a future release\n";
      logging_function_00._M_str = in_stack_fffffffffffff758;
      logging_function_00._M_len = in_stack_fffffffffffff750;
      source_file_00._M_str = in_stack_fffffffffffff748;
      source_file_00._M_len = (size_t)paVar8;
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,iVar7,(LogFlags)flag,in_stack_fffffffffffff830,
                 fmt);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d8,(char *)__s,(allocator<char> *)in_RSI);
    bVar1 = ArgsManager::GetBoolArg
                      ((ArgsManager *)in_stack_fffffffffffff690,
                       (string *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                       (bool)uVar2);
    *(bool *)((long)in_RCX + 0x3b) = bVar1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::allocator<char>::~allocator(local_6c1);
    anon_unknown.dwarf_1d7be5b::ApplyArgsManOptions
              (in_stack_fffffffffffff710,in_stack_fffffffffffff708);
    util::Result<void>::Result((Result<void> *)in_stack_fffffffffffff690);
  }
  else {
    this = local_508;
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)in_stack_fffffffffffff6d0,(allocator<char> *)in_stack_fffffffffffff6c8);
    Untranslated((string *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0));
    CChainParams::GetChainTypeString_abi_cxx11_((CChainParams *)in_stack_fffffffffffff690);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)CONCAT17(uVar2,in_stack_fffffffffffff6e8),args);
    util::Result<void>::Result(in_stack_fffffffffffff698,(Error *)in_stack_fffffffffffff690);
    util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    std::allocator<char>::~allocator((allocator<char> *)local_69b);
  }
LAB_011dc52e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& argsman, const CChainParams& chainparams, MemPoolOptions& mempool_opts)
{
    mempool_opts.check_ratio = argsman.GetIntArg("-checkmempool", mempool_opts.check_ratio);

    if (auto mb = argsman.GetIntArg("-maxmempool")) mempool_opts.max_size_bytes = *mb * 1'000'000;

    if (auto hours = argsman.GetIntArg("-mempoolexpiry")) mempool_opts.expiry = std::chrono::hours{*hours};

    // incremental relay fee sets the minimum feerate increase necessary for replacement in the mempool
    // and the amount the mempool min fee increases above the feerate of txs evicted due to mempool limiting.
    if (argsman.IsArgSet("-incrementalrelayfee")) {
        if (std::optional<CAmount> inc_relay_fee = ParseMoney(argsman.GetArg("-incrementalrelayfee", ""))) {
            mempool_opts.incremental_relay_feerate = CFeeRate{inc_relay_fee.value()};
        } else {
            return util::Error{AmountErrMsg("incrementalrelayfee", argsman.GetArg("-incrementalrelayfee", ""))};
        }
    }

    if (argsman.IsArgSet("-minrelaytxfee")) {
        if (std::optional<CAmount> min_relay_feerate = ParseMoney(argsman.GetArg("-minrelaytxfee", ""))) {
            // High fee check is done afterward in CWallet::Create()
            mempool_opts.min_relay_feerate = CFeeRate{min_relay_feerate.value()};
        } else {
            return util::Error{AmountErrMsg("minrelaytxfee", argsman.GetArg("-minrelaytxfee", ""))};
        }
    } else if (mempool_opts.incremental_relay_feerate > mempool_opts.min_relay_feerate) {
        // Allow only setting incremental fee to control both
        mempool_opts.min_relay_feerate = mempool_opts.incremental_relay_feerate;
        LogPrintf("Increasing minrelaytxfee to %s to match incrementalrelayfee\n", mempool_opts.min_relay_feerate.ToString());
    }

    // Feerate used to define dust.  Shouldn't be changed lightly as old
    // implementations may inadvertently create non-standard transactions
    if (argsman.IsArgSet("-dustrelayfee")) {
        if (std::optional<CAmount> parsed = ParseMoney(argsman.GetArg("-dustrelayfee", ""))) {
            mempool_opts.dust_relay_feerate = CFeeRate{parsed.value()};
        } else {
            return util::Error{AmountErrMsg("dustrelayfee", argsman.GetArg("-dustrelayfee", ""))};
        }
    }

    mempool_opts.permit_bare_multisig = argsman.GetBoolArg("-permitbaremultisig", DEFAULT_PERMIT_BAREMULTISIG);

    if (argsman.GetBoolArg("-datacarrier", DEFAULT_ACCEPT_DATACARRIER)) {
        mempool_opts.max_datacarrier_bytes = argsman.GetIntArg("-datacarriersize", MAX_OP_RETURN_RELAY);
    } else {
        mempool_opts.max_datacarrier_bytes = std::nullopt;
    }

    mempool_opts.require_standard = !argsman.GetBoolArg("-acceptnonstdtxn", DEFAULT_ACCEPT_NON_STD_TXN);
    if (!chainparams.IsTestChain() && !mempool_opts.require_standard) {
        return util::Error{strprintf(Untranslated("acceptnonstdtxn is not currently supported for %s chain"), chainparams.GetChainTypeString())};
    }

    mempool_opts.full_rbf = argsman.GetBoolArg("-mempoolfullrbf", mempool_opts.full_rbf);
    if (!mempool_opts.full_rbf) {
        LogInfo("Warning: mempoolfullrbf=0 set but deprecated and will be removed in a future release\n");
    }

    mempool_opts.persist_v1_dat = argsman.GetBoolArg("-persistmempoolv1", mempool_opts.persist_v1_dat);

    ApplyArgsManOptions(argsman, mempool_opts.limits);

    return {};
}